

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

double HeadingDiff(double head1,double head2)

{
  LTError *this;
  double dVar1;
  
  if (NAN(head1) || NAN(head2)) {
    dVar1 = NAN;
  }
  else {
    dVar1 = head2 - head1;
    if (180.0 < ABS(dVar1)) {
      dVar1 = head2;
      if (head2 <= head1) {
        dVar1 = head2 + 360.0;
      }
      dVar1 = dVar1 - (double)(~-(ulong)(head1 < head2) & (ulong)head1 |
                              (ulong)(head1 + 360.0) & -(ulong)(head1 < head2));
      if (180.0 < ABS(dVar1)) {
        this = (LTError *)__cxa_allocate_exception(0x18);
        LTError::LTError(this,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                         ,0x283,"HeadingDiff",logFATAL,"ASSERT FAILED: %s",
                         "std::abs(head2-head1) <= 180");
        __cxa_throw(this,&LTError::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return dVar1;
}

Assistant:

double HeadingDiff (double head1, double head2)
{
    // if either value is nan return nan
    if (std::isnan(head1) || std::isnan(head2)) return NAN;
    
    // if 0° North lies between head1 and head2 then simple
    // diff doesn't work
    if ( std::abs(head2-head1) > 180 ) {
        // add 360° to the lesser value...then diff works
        if ( head1 < head2 )
            head1 += 360;
        else
            head2 += 360;
        LOG_ASSERT ( std::abs(head2-head1) <= 180 );
    }
    
    return head2 - head1;
}